

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourceCacheVk.hpp
# Opt level: O2

Resource * __thiscall
Diligent::ShaderResourceCacheVk::DescriptorSet::GetResource(DescriptorSet *this,Uint32 CacheOffset)

{
  char (*in_R8) [17];
  string msg;
  Uint32 local_34;
  string local_30;
  
  if (this->m_NumResources <= CacheOffset) {
    local_34 = CacheOffset;
    FormatString<char[8],unsigned_int,char[17]>
              (&local_30,(Diligent *)"Offset ",(char (*) [8])&local_34,(uint *)0x5c95f2,in_R8);
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"GetResource",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/ShaderResourceCacheVk.hpp"
               ,0xa1);
    std::__cxx11::string::~string((string *)&local_30);
    CacheOffset = local_34;
  }
  return this->m_pResources + CacheOffset;
}

Assistant:

const Resource& GetResource(Uint32 CacheOffset) const
        {
            VERIFY(CacheOffset < m_NumResources, "Offset ", CacheOffset, " is out of range");
            return m_pResources[CacheOffset];
        }